

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_compute_compact_branch
               (DisasContext_conflict6 *ctx,uint32_t opc,int rs,int rt,int32_t offset)

{
  TCGContext_conflict6 *tcg_ctx_00;
  bool bVar1;
  uint uVar2;
  TCGCond TVar3;
  TCGv_i64 t;
  TCGv_i64 t_00;
  target_ulong tVar4;
  TCGLabel *l;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 input_overflow;
  TCGv_i64 t4;
  TCGv_i64 t3;
  TCGv_i64 t2;
  TCGLabel *fs;
  TCGv_i64 toffset;
  TCGv_i64 tbase;
  int m16_lowbit;
  TCGv_i64 t1;
  TCGv_i64 t0;
  int bcond_compute;
  TCGContext_conflict6 *tcg_ctx;
  int32_t offset_local;
  int rt_local;
  int rs_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  bVar1 = false;
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  uVar2 = (uint)((ctx->hflags & 0x400) != 0);
  if ((ctx->hflags & 0x87f800) != 0) {
    generate_exception_end(ctx,0x14);
    goto LAB_00d33778;
  }
  if (opc == 0xc8000000) {
LAB_00d32e7e:
    tVar4 = addr_add(ctx,(ctx->base).pc_next + 4,(long)offset);
    ctx->btarget = tVar4;
  }
  else if (opc == 0xd8000000) {
LAB_00d32ea7:
    if (rs == 0) {
      pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
      gen_load_gpr(tcg_ctx_00,pTVar5,rt);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,pTVar6,(long)offset);
      gen_op_addr_add(ctx,tcg_ctx_00->btarget,pTVar5,pTVar6);
      tcg_temp_free_i64(tcg_ctx_00,pTVar5);
      tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    }
    else {
      gen_load_gpr(tcg_ctx_00,t,rs);
      tVar4 = addr_add(ctx,(ctx->base).pc_next + 4,(long)offset);
      ctx->btarget = tVar4;
    }
    bVar1 = rs != 0;
  }
  else {
    if (opc == 0xe8000000) goto LAB_00d32e7e;
    if (opc == 0xf8000000) goto LAB_00d32ea7;
    if ((opc == 0x18000000) || (opc == 0x1c000000)) {
      if ((rs == 0) || (rs == rt)) {
        tcg_gen_movi_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[0x1f],(ctx->base).pc_next + 4 + (long)(int)uVar2);
      }
      gen_load_gpr(tcg_ctx_00,t,rs);
      gen_load_gpr(tcg_ctx_00,t_00,rt);
      bVar1 = true;
      tVar4 = addr_add(ctx,(ctx->base).pc_next + 4,(long)offset);
      ctx->btarget = tVar4;
    }
    else {
      if (opc != 0x20000000) {
        if ((opc == 0x58000000) || (opc == 0x5c000000)) {
          gen_load_gpr(tcg_ctx_00,t,rs);
          gen_load_gpr(tcg_ctx_00,t_00,rt);
          bVar1 = true;
          tVar4 = addr_add(ctx,(ctx->base).pc_next + 4,(long)offset);
          ctx->btarget = tVar4;
          goto LAB_00d32f74;
        }
        if (opc != 0x60000000) {
          generate_exception_end(ctx,0x14);
          goto LAB_00d33778;
        }
      }
      gen_load_gpr(tcg_ctx_00,t,rs);
      gen_load_gpr(tcg_ctx_00,t_00,rt);
      bVar1 = true;
      tVar4 = addr_add(ctx,(ctx->base).pc_next + 4,(long)offset);
      ctx->btarget = tVar4;
      if ((rs <= rt) && (rs == 0)) {
        tcg_gen_movi_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[0x1f],(ctx->base).pc_next + 4 + (long)(int)uVar2);
      }
    }
  }
LAB_00d32f74:
  if (bVar1) {
    l = gen_new_label_mips64el(tcg_ctx_00);
    save_cpu_state(ctx,0);
    if (opc == 0xd8000000) {
      TVar3 = tcg_invert_cond(TCG_COND_EQ);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t,0,l);
    }
    else if (opc == 0xf8000000) {
      TVar3 = tcg_invert_cond(TCG_COND_NE);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t,0,l);
    }
    else if (opc == 0x18000000) {
      if ((rs == 0) && (rt != 0)) {
        TVar3 = tcg_invert_cond(TCG_COND_LE);
        tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
      }
      else if ((rs == 0) || ((rt == 0 || (rs != rt)))) {
        TVar3 = tcg_invert_cond(TCG_COND_GEU);
        tcg_gen_brcond_i64_mips64el(tcg_ctx_00,TVar3,t,t_00,l);
      }
      else {
        TVar3 = tcg_invert_cond(TCG_COND_GE);
        tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
      }
    }
    else if (opc == 0x1c000000) {
      if ((rs == 0) && (rt != 0)) {
        TVar3 = tcg_invert_cond(TCG_COND_GT);
        tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
      }
      else if ((rs == 0) || ((rt == 0 || (rs != rt)))) {
        TVar3 = tcg_invert_cond(TCG_COND_LTU);
        tcg_gen_brcond_i64_mips64el(tcg_ctx_00,TVar3,t,t_00,l);
      }
      else {
        TVar3 = tcg_invert_cond(TCG_COND_LT);
        tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
      }
    }
    else if (opc == 0x20000000) {
LAB_00d333e3:
      if (rs < rt) {
        if ((rs < rt) && (rs == 0)) {
          if (opc == 0x20000000) {
            TVar3 = tcg_invert_cond(TCG_COND_EQ);
            tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
          }
          else {
            TVar3 = tcg_invert_cond(TCG_COND_NE);
            tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
          }
        }
        else if (opc == 0x20000000) {
          TVar3 = tcg_invert_cond(TCG_COND_EQ);
          tcg_gen_brcond_i64_mips64el(tcg_ctx_00,TVar3,t,t_00,l);
        }
        else {
          TVar3 = tcg_invert_cond(TCG_COND_NE);
          tcg_gen_brcond_i64_mips64el(tcg_ctx_00,TVar3,t,t_00,l);
        }
      }
      else {
        pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
        pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
        ret = tcg_temp_new_i64(tcg_ctx_00);
        ret_00 = tcg_temp_new_i64(tcg_ctx_00);
        gen_load_gpr(tcg_ctx_00,t,rs);
        gen_load_gpr(tcg_ctx_00,t_00,rt);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,pTVar5,t);
        tcg_gen_setcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,ret_00,pTVar5,t);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,pTVar6,t_00);
        tcg_gen_setcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,ret,pTVar6,t_00);
        tcg_gen_or_i64_mips64el(tcg_ctx_00,ret_00,ret_00,ret);
        tcg_gen_add_i64(tcg_ctx_00,ret,pTVar5,pTVar6);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,ret,ret);
        tcg_gen_xor_i64_mips64el(tcg_ctx_00,pTVar5,pTVar5,pTVar6);
        tcg_gen_xor_i64_mips64el(tcg_ctx_00,pTVar6,ret,pTVar6);
        tcg_gen_andc_i64_mips64el(tcg_ctx_00,pTVar5,pTVar6,pTVar5);
        tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_LT,ret,pTVar5,0);
        tcg_gen_or_i64_mips64el(tcg_ctx_00,ret,ret,ret_00);
        if (opc == 0x20000000) {
          TVar3 = tcg_invert_cond(TCG_COND_NE);
          tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,ret,0,l);
        }
        else {
          TVar3 = tcg_invert_cond(TCG_COND_EQ);
          tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,ret,0,l);
        }
        tcg_temp_free_i64(tcg_ctx_00,ret_00);
        tcg_temp_free_i64(tcg_ctx_00,ret);
        tcg_temp_free_i64(tcg_ctx_00,pTVar6);
        tcg_temp_free_i64(tcg_ctx_00,pTVar5);
      }
    }
    else if (opc == 0x58000000) {
      if ((rs == 0) && (rt != 0)) {
        TVar3 = tcg_invert_cond(TCG_COND_LE);
        tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
      }
      else if ((rs == 0) || ((rt == 0 || (rs != rt)))) {
        TVar3 = tcg_invert_cond(TCG_COND_GE);
        tcg_gen_brcond_i64_mips64el(tcg_ctx_00,TVar3,t,t_00,l);
      }
      else {
        TVar3 = tcg_invert_cond(TCG_COND_GE);
        tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
      }
    }
    else {
      if (opc != 0x5c000000) {
        if (opc != 0x60000000) {
          generate_exception_end(ctx,0x14);
          goto LAB_00d33778;
        }
        goto LAB_00d333e3;
      }
      if ((rs == 0) && (rt != 0)) {
        TVar3 = tcg_invert_cond(TCG_COND_GT);
        tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
      }
      else if ((rs == 0) || ((rt == 0 || (rs != rt)))) {
        TVar3 = tcg_invert_cond(TCG_COND_LT);
        tcg_gen_brcond_i64_mips64el(tcg_ctx_00,TVar3,t,t_00,l);
      }
      else {
        TVar3 = tcg_invert_cond(TCG_COND_LT);
        tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TVar3,t_00,0,l);
      }
    }
    gen_goto_tb(ctx,1,ctx->btarget);
    gen_set_label(tcg_ctx_00,l);
    ctx->hflags = ctx->hflags | 0x800000;
    goto LAB_00d33778;
  }
  if (opc == 0xc8000000) {
LAB_00d33015:
    ctx->hflags = ctx->hflags | 0x800;
  }
  else {
    if (opc != 0xd8000000) {
      if (opc == 0xe8000000) {
        tcg_gen_movi_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[0x1f],(ctx->base).pc_next + 4 + (long)(int)uVar2);
        goto LAB_00d33015;
      }
      if (opc != 0xf8000000) {
        generate_exception_end(ctx,0x14);
        goto LAB_00d33778;
      }
      tcg_gen_movi_i64_mips64el
                (tcg_ctx_00,tcg_ctx_00->cpu_gpr[0x1f],(ctx->base).pc_next + 4 + (long)(int)uVar2);
    }
    ctx->hflags = ctx->hflags | 0x2000;
  }
  gen_branch(ctx,4);
LAB_00d33778:
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,t_00);
  return;
}

Assistant:

static void gen_compute_compact_branch(DisasContext *ctx, uint32_t opc,
                                       int rs, int rt, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int m16_lowbit = (ctx->hflags & MIPS_HFLAG_M16) != 0;

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
#ifdef MIPS_DEBUG_DISAS
        LOG_DISAS("Branch in delay / forbidden slot at PC 0x" TARGET_FMT_lx
                  "\n", ctx->base.pc_next);
#endif
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    /* Load needed operands and calculate btarget */
    switch (opc) {
    /* compact branch */
    case OPC_BOVC: /* OPC_BEQZALC, OPC_BEQC */
    case OPC_BNVC: /* OPC_BNEZALC, OPC_BNEC */
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        if (rs <= rt && rs == 0) {
            /* OPC_BEQZALC, OPC_BNEZALC */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
        }
        break;
    case OPC_BLEZC: /* OPC_BGEZC, OPC_BGEC */
    case OPC_BGTZC: /* OPC_BLTZC, OPC_BLTC */
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BLEZALC: /* OPC_BGEZALC, OPC_BGEUC */
    case OPC_BGTZALC: /* OPC_BLTZALC, OPC_BLTUC */
        if (rs == 0 || rs == rt) {
            /* OPC_BLEZALC, OPC_BGEZALC */
            /* OPC_BGTZALC, OPC_BLTZALC */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
        }
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BC:
    case OPC_BALC:
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BEQZC:
    case OPC_BNEZC:
        if (rs != 0) {
            /* OPC_BEQZC, OPC_BNEZC */
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
            ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        } else {
            /* OPC_JIC, OPC_JIALC */
            TCGv tbase = tcg_temp_new(tcg_ctx);
            TCGv toffset = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, tbase, rt);
            tcg_gen_movi_tl(tcg_ctx, toffset, offset);
            gen_op_addr_add(ctx, tcg_ctx->btarget, tbase, toffset);
            tcg_temp_free(tcg_ctx, tbase);
            tcg_temp_free(tcg_ctx, toffset);
        }
        break;
    default:
        MIPS_INVAL("Compact branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    if (bcond_compute == 0) {
        /* Uncoditional compact branch */
        switch (opc) {
        case OPC_JIALC:
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
            /* Fallthrough */
        case OPC_JIC:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_BALC:
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
            /* Fallthrough */
        case OPC_BC:
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        default:
            MIPS_INVAL("Compact branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }

        /* Generating branch here as compact branches don't have delay slot */
        gen_branch(ctx, 4);
    } else {
        /* Conditional compact branch */
        TCGLabel *fs = gen_new_label(tcg_ctx);
        save_cpu_state(ctx, 0);

        switch (opc) {
        case OPC_BLEZALC: /* OPC_BGEZALC, OPC_BGEUC */
            if (rs == 0 && rt != 0) {
                /* OPC_BLEZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LE), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BGEZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t1, 0, fs);
            } else {
                /* OPC_BGEUC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GEU), t0, t1, fs);
            }
            break;
        case OPC_BGTZALC: /* OPC_BLTZALC, OPC_BLTUC */
            if (rs == 0 && rt != 0) {
                /* OPC_BGTZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GT), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BLTZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t1, 0, fs);
            } else {
                /* OPC_BLTUC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LTU), t0, t1, fs);
            }
            break;
        case OPC_BLEZC: /* OPC_BGEZC, OPC_BGEC */
            if (rs == 0 && rt != 0) {
                /* OPC_BLEZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LE), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BGEZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t1, 0, fs);
            } else {
                /* OPC_BGEC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t0, t1, fs);
            }
            break;
        case OPC_BGTZC: /* OPC_BLTZC, OPC_BLTC */
            if (rs == 0 && rt != 0) {
                /* OPC_BGTZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GT), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BLTZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t1, 0, fs);
            } else {
                /* OPC_BLTC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t0, t1, fs);
            }
            break;
        case OPC_BOVC: /* OPC_BEQZALC, OPC_BEQC */
        case OPC_BNVC: /* OPC_BNEZALC, OPC_BNEC */
            if (rs >= rt) {
                /* OPC_BOVC, OPC_BNVC */
                TCGv t2 = tcg_temp_new(tcg_ctx);
                TCGv t3 = tcg_temp_new(tcg_ctx);
                TCGv t4 = tcg_temp_new(tcg_ctx);
                TCGv input_overflow = tcg_temp_new(tcg_ctx);

                gen_load_gpr(tcg_ctx, t0, rs);
                gen_load_gpr(tcg_ctx, t1, rt);
                tcg_gen_ext32s_tl(tcg_ctx, t2, t0);
                tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, input_overflow, t2, t0);
                tcg_gen_ext32s_tl(tcg_ctx, t3, t1);
                tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, t4, t3, t1);
                tcg_gen_or_tl(tcg_ctx, input_overflow, input_overflow, t4);

                tcg_gen_add_tl(tcg_ctx, t4, t2, t3);
                tcg_gen_ext32s_tl(tcg_ctx, t4, t4);
                tcg_gen_xor_tl(tcg_ctx, t2, t2, t3);
                tcg_gen_xor_tl(tcg_ctx, t3, t4, t3);
                tcg_gen_andc_tl(tcg_ctx, t2, t3, t2);
                tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, t4, t2, 0);
                tcg_gen_or_tl(tcg_ctx, t4, t4, input_overflow);
                if (opc == OPC_BOVC) {
                    /* OPC_BOVC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t4, 0, fs);
                } else {
                    /* OPC_BNVC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t4, 0, fs);
                }
                tcg_temp_free(tcg_ctx, input_overflow);
                tcg_temp_free(tcg_ctx, t4);
                tcg_temp_free(tcg_ctx, t3);
                tcg_temp_free(tcg_ctx, t2);
            } else if (rs < rt && rs == 0) {
                /* OPC_BEQZALC, OPC_BNEZALC */
                if (opc == OPC_BEQZALC) {
                    /* OPC_BEQZALC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t1, 0, fs);
                } else {
                    /* OPC_BNEZALC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t1, 0, fs);
                }
            } else {
                /* OPC_BEQC, OPC_BNEC */
                if (opc == OPC_BEQC) {
                    /* OPC_BEQC */
                    tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t0, t1, fs);
                } else {
                    /* OPC_BNEC */
                    tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t0, t1, fs);
                }
            }
            break;
        case OPC_BEQZC:
            tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t0, 0, fs);
            break;
        case OPC_BNEZC:
            tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t0, 0, fs);
            break;
        default:
            MIPS_INVAL("Compact conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }

        /* Generating branch here as compact branches don't have delay slot */
        gen_goto_tb(ctx, 1, ctx->btarget);
        gen_set_label(tcg_ctx, fs);

        ctx->hflags |= MIPS_HFLAG_FBNSLOT;
    }

out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}